

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

SRes LzmaEnc_MemEncode(CLzmaEncHandle p,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,
                      int writeEndMark,ICompressProgressPtr progress,ISzAllocPtr alloc,
                      ISzAllocPtr allocBig)

{
  ISeqOutStream_ local_60;
  CLzmaEnc_SeqOutStreamBuf outStream;
  SRes res;
  int writeEndMark_local;
  SizeT srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  CLzmaEncHandle p_local;
  
  local_60.Write = SeqOutStreamBuf_Write;
  outStream.data = (Byte *)*destLen;
  outStream.rem._0_4_ = 0;
  p->writeEndMark = writeEndMark;
  (p->rc).outStream = &local_60;
  outStream.vt.Write = (_func_size_t_ISeqOutStreamPtr_void_ptr_size_t *)dest;
  outStream._28_4_ = writeEndMark;
  outStream.overflow = LzmaEnc_MemPrepare(p,src,srcLen,0,alloc,allocBig);
  if (((outStream.overflow == 0) &&
      (outStream.overflow = LzmaEnc_Encode2(p,progress), outStream.overflow == 0)) &&
     (p->nowPos64 != srcLen)) {
    outStream.overflow = 0xb;
  }
  *destLen = *destLen - (long)outStream.data;
  if ((int)outStream.rem == 0) {
    p_local._4_4_ = outStream.overflow;
  }
  else {
    p_local._4_4_ = 7;
  }
  return p_local._4_4_;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle p, Byte *dest, SizeT *destLen, const Byte *src, SizeT srcLen,
    int writeEndMark, ICompressProgressPtr progress, ISzAllocPtr alloc, ISzAllocPtr allocBig)
{
  SRes res;
  // GET_CLzmaEnc_p

  CLzmaEnc_SeqOutStreamBuf outStream;

  outStream.vt.Write = SeqOutStreamBuf_Write;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  p->rc.outStream = &outStream.vt;

  res = LzmaEnc_MemPrepare(p, src, srcLen, 0, alloc, allocBig);
  
  if (res == SZ_OK)
  {
    res = LzmaEnc_Encode2(p, progress);
    if (res == SZ_OK && p->nowPos64 != srcLen)
      res = SZ_ERROR_FAIL;
  }

  *destLen -= (SizeT)outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}